

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::setComboBoxText(QInputDialogPrivate *this,QString *text)

{
  bool bVar1;
  QFlagsStorage<Qt::MatchFlag> QVar2;
  int iVar3;
  QComboBox *in_RSI;
  QComboBox *in_RDI;
  int index;
  QString *text_00;
  QFlagsStorage<Qt::MatchFlag> in_stack_ffffffffffffffec;
  
  text_00 = *(QString **)&in_RDI[0x13].super_QWidget.field_0x18;
  QVar2.i = (Int)Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  iVar3 = QComboBox::findText(in_RSI,text_00,(MatchFlags)in_stack_ffffffffffffffec.i);
  if (iVar3 == -1) {
    bVar1 = QComboBox::isEditable(in_RDI);
    if (bVar1) {
      QComboBox::setEditText((QComboBox *)CONCAT44(iVar3,QVar2.i),(QString *)in_RSI);
    }
  }
  else {
    QComboBox::setCurrentIndex((QComboBox *)CONCAT44(iVar3,QVar2.i),(int)((ulong)in_RSI >> 0x20));
  }
  return;
}

Assistant:

void QInputDialogPrivate::setComboBoxText(const QString &text)
{
    int index = comboBox->findText(text);
    if (index != -1) {
        comboBox->setCurrentIndex(index);
    } else if (comboBox->isEditable()) {
        comboBox->setEditText(text);
    }
}